

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_can_have_alpha(LodePNGColorMode *info)

{
  size_t sVar1;
  
  if ((info->key_defined == 0) && ((info->colortype & LCT_GREY_ALPHA) == LCT_GREY)) {
    if (info->palettesize != 0) {
      sVar1 = 0;
      do {
        if (info->palette[sVar1 * 4 + 3] != 0xff) {
          return 1;
        }
        sVar1 = sVar1 + 1;
      } while (info->palettesize != sVar1);
    }
    return 0;
  }
  return 1;
}

Assistant:

unsigned lodepng_can_have_alpha(const LodePNGColorMode* info)
{
	return info->key_defined
		|| lodepng_is_alpha_type(info)
		|| lodepng_has_palette_alpha(info);
}